

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

int Fl::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int in_EAX;
  int iVar1;
  char *pcVar2;
  int in_EDX;
  Atom AVar3;
  
  while ((dst != (EVP_PKEY_CTX *)0x0 && (iVar1 = (int)src, -1 < iVar1))) {
    if (in_EDX < 2) {
      if (fl_selection_buffer_length[in_EDX] <= iVar1) {
        if (fl_selection_buffer[in_EDX] != (char *)0x0) {
          operator_delete__(fl_selection_buffer[in_EDX]);
        }
        pcVar2 = (char *)operator_new__((ulong)(iVar1 + 100U));
        fl_selection_buffer[in_EDX] = pcVar2;
        fl_selection_buffer_length[in_EDX] = iVar1 + 100U;
      }
      memcpy(fl_selection_buffer[in_EDX],dst,(ulong)src & 0xffffffff);
      fl_selection_buffer[in_EDX][(ulong)src & 0xffffffff] = '\0';
      fl_selection_length[in_EDX] = iVar1;
      fl_i_own_selection[in_EDX] = '\x01';
      fl_selection_type[in_EDX] = "text/plain";
      AVar3 = 1;
      if (in_EDX != 0) {
        AVar3 = CLIPBOARD;
      }
      iVar1 = XSetSelectionOwner(fl_display,AVar3,fl_message_window,fl_event_time);
      return iVar1;
    }
    in_EAX = copy(dst,(EVP_PKEY_CTX *)((ulong)src & 0xffffffff));
    in_EDX = 1;
  }
  return in_EAX;
}

Assistant:

void Fl::copy(const char *stuff, int len, int clipboard, const char *type) {
  if (!stuff || len<0) return;

  if (clipboard >= 2) {
    copy(stuff, len, 0, type);
    copy(stuff, len, 1, type);
    return;
  }

  if (len+1 > fl_selection_buffer_length[clipboard]) {
    delete[] fl_selection_buffer[clipboard];
    fl_selection_buffer[clipboard] = new char[len+100];
    fl_selection_buffer_length[clipboard] = len+100;
  }
  memcpy(fl_selection_buffer[clipboard], stuff, len);
  fl_selection_buffer[clipboard][len] = 0; // needed for direct paste
  fl_selection_length[clipboard] = len;
  fl_i_own_selection[clipboard] = 1;
  fl_selection_type[clipboard] = Fl::clipboard_plain_text;
  Atom property = clipboard ? CLIPBOARD : XA_PRIMARY;
  XSetSelectionOwner(fl_display, property, fl_message_window, fl_event_time);
}